

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall TPZManVector<long_double,_3>::Shrink(TPZManVector<long_double,_3> *this)

{
  longdouble *plVar1;
  long lVar2;
  longdouble *plVar3;
  ulong uVar4;
  
  uVar4 = (this->super_TPZVec<long_double>).fNElements;
  if (3 < (long)uVar4) {
    if ((this->super_TPZVec<long_double>).fNAlloc == uVar4) {
      return;
    }
    lVar2 = 0;
    plVar3 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 << 4);
    plVar1 = (this->super_TPZVec<long_double>).fStore;
    do {
      *(unkbyte10 *)((long)plVar3 + lVar2) = *(unkbyte10 *)((long)plVar1 + lVar2);
      lVar2 = lVar2 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    operator_delete__(plVar1);
    (this->super_TPZVec<long_double>).fStore = plVar3;
    (this->super_TPZVec<long_double>).fNAlloc = (this->super_TPZVec<long_double>).fNElements;
    return;
  }
  plVar3 = (this->super_TPZVec<long_double>).fStore;
  plVar1 = this->fExtAlloc;
  if (plVar3 == plVar1) {
    return;
  }
  if ((long)uVar4 < 1) {
    if (plVar3 == (longdouble *)0x0) goto LAB_00b29fd4;
  }
  else {
    lVar2 = 0;
    do {
      *(unkbyte10 *)((long)plVar1 + lVar2) = *(unkbyte10 *)((long)plVar3 + lVar2);
      lVar2 = lVar2 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  operator_delete__(plVar3);
LAB_00b29fd4:
  (this->super_TPZVec<long_double>).fStore = plVar1;
  (this->super_TPZVec<long_double>).fNAlloc = 3;
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}